

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTDMT_jobDescription * ZSTDMT_createJobsTable(U32 *nbJobsPtr,ZSTD_customMem cMem)

{
  ZSTD_customMem customMem;
  ZSTD_customMem cMem_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint *in_RDI;
  int initError;
  ZSTDMT_jobDescription *jobTable;
  U32 jobNb;
  U32 nbJobs;
  U32 nbJobsLog2;
  undefined1 *puVar5;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar6;
  ZSTDMT_jobDescription *local_8;
  
  puVar5 = &stack0x00000008;
  uVar1 = ZSTD_highbit32(0);
  iVar3 = uVar1 + 1;
  uVar4 = 1 << ((byte)iVar3 & 0x1f);
  customMem.customAlloc._4_4_ = in_stack_ffffffffffffffd4;
  customMem.customAlloc._0_4_ = in_stack_ffffffffffffffd0;
  customMem.customFree = (ZSTD_freeFunction)in_stack_ffffffffffffffd8;
  customMem.opaque._0_4_ = in_stack_ffffffffffffffe0;
  customMem.opaque._4_4_ = in_stack_ffffffffffffffe4;
  local_8 = (ZSTDMT_jobDescription *)ZSTD_customCalloc(*(size_t *)(puVar5 + 0x10),customMem);
  uVar1 = 0;
  if (local_8 == (ZSTDMT_jobDescription *)0x0) {
    local_8 = (ZSTDMT_jobDescription *)0x0;
  }
  else {
    *in_RDI = uVar4;
    for (uVar6 = 0; uVar6 < uVar4; uVar6 = uVar6 + 1) {
      uVar2 = pthread_mutex_init((pthread_mutex_t *)&local_8[uVar6].job_mutex,
                                 (pthread_mutexattr_t *)0x0);
      uVar2 = uVar2 | uVar1;
      uVar1 = pthread_cond_init((pthread_cond_t *)&local_8[uVar6].job_cond,(pthread_condattr_t *)0x0
                               );
      uVar1 = uVar1 | uVar2;
    }
    if (uVar1 != 0) {
      cMem_00.customAlloc._4_4_ = uVar6;
      cMem_00.customAlloc._0_4_ = in_stack_ffffffffffffffe0;
      cMem_00.customFree._0_4_ = uVar4;
      cMem_00.customFree._4_4_ = iVar3;
      cMem_00.opaque = in_RDI;
      ZSTDMT_freeJobsTable
                ((ZSTDMT_jobDescription *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                 (U32)((ulong)puVar5 >> 0x20),cMem_00);
      local_8 = (ZSTDMT_jobDescription *)0x0;
    }
  }
  return local_8;
}

Assistant:

static ZSTDMT_jobDescription* ZSTDMT_createJobsTable(U32* nbJobsPtr, ZSTD_customMem cMem)
{
    U32 const nbJobsLog2 = ZSTD_highbit32(*nbJobsPtr) + 1;
    U32 const nbJobs = 1 << nbJobsLog2;
    U32 jobNb;
    ZSTDMT_jobDescription* const jobTable = (ZSTDMT_jobDescription*)
                ZSTD_customCalloc(nbJobs * sizeof(ZSTDMT_jobDescription), cMem);
    int initError = 0;
    if (jobTable==NULL) return NULL;
    *nbJobsPtr = nbJobs;
    for (jobNb=0; jobNb<nbJobs; jobNb++) {
        initError |= ZSTD_pthread_mutex_init(&jobTable[jobNb].job_mutex, NULL);
        initError |= ZSTD_pthread_cond_init(&jobTable[jobNb].job_cond, NULL);
    }
    if (initError != 0) {
        ZSTDMT_freeJobsTable(jobTable, nbJobs, cMem);
        return NULL;
    }
    return jobTable;
}